

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

int BN_ucmp(BIGNUM *a,BIGNUM *b)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)a->top;
  iVar3 = a->top - b->top;
  if (iVar3 != 0) {
    return iVar3;
  }
  do {
    if ((int)uVar4 < 1) {
      return 0;
    }
    lVar1 = uVar4 - 1;
    lVar2 = uVar4 - 1;
    uVar4 = uVar4 - 1;
  } while (a->d[lVar1] == b->d[lVar2]);
  return (b->d[lVar2] < a->d[lVar1]) - 1 | 1;
}

Assistant:

int BN_ucmp(const BIGNUM *a, const BIGNUM *b)
{
    int i;
    BN_ULONG t1, t2, *ap, *bp;

    bn_check_top(a);
    bn_check_top(b);

    i = a->top - b->top;
    if (i != 0)
        return (i);
    ap = a->d;
    bp = b->d;
    for (i = a->top - 1; i >= 0; i--) {
        t1 = ap[i];
        t2 = bp[i];
        if (t1 != t2)
            return ((t1 > t2) ? 1 : -1);
    }
    return (0);
}